

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O3

void __thiscall
Js::AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
          (AutoRegisterIgnoreExceptionWrapper *this,ThreadContext *threadContext)

{
  code *pcVar1;
  bool bVar2;
  DebuggingFlags *pDVar3;
  undefined4 *puVar4;
  
  this->m_threadContext = threadContext;
  pDVar3 = DebugManager::GetDebuggingFlags(threadContext->debugManager);
  bVar2 = DebuggingFlags::IsBuiltInWrapperPresent(pDVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xf,"(!IsRegistered(threadContext))",
                                "BuiltInWrapper is already registered.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pDVar3 = DebugManager::GetDebuggingFlags(this->m_threadContext->debugManager);
  DebuggingFlags::SetIsBuiltInWrapperPresent(pDVar3,true);
  return;
}

Assistant:

AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper(ThreadContext* threadContext) :
        m_threadContext(threadContext)
    {
        AssertMsg(!IsRegistered(threadContext), "BuiltInWrapper is already registered.");
        m_threadContext->GetDebugManager()->GetDebuggingFlags()->SetIsBuiltInWrapperPresent(true);
    }